

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgdessll(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG nrows,LONGLONG *length,
             LONGLONG *heapaddr,int *status)

{
  tcolumn *ptVar1;
  long lVar2;
  int iVar3;
  tcolumn *colptr;
  LONGLONG descript8 [2];
  uint local_60;
  uint local_5c;
  uint descript4 [2];
  long ii;
  LONGLONG bytepos;
  LONGLONG rowsize;
  LONGLONG *heapaddr_local;
  LONGLONG *length_local;
  LONGLONG nrows_local;
  LONGLONG firstrow_local;
  int colnum_local;
  fitsfile *fptr_local;
  
  memset(&local_60,0,8);
  memset(&colptr,0,0x10);
  if (*status < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    ptVar1 = fptr->Fptr->tableptr;
    iVar3 = colnum + -1;
    if (ptVar1[iVar3].tdatatype < 0) {
      lVar2 = fptr->Fptr->rowlength;
      ii = fptr->Fptr->datastart + lVar2 * (firstrow + -1) + ptVar1[iVar3].tbcol;
      rowsize = (LONGLONG)heapaddr;
      heapaddr_local = length;
      if ((ptVar1[iVar3].tform[0] == 'P') || (ptVar1[iVar3].tform[1] == 'P')) {
        descript4[0] = 0;
        descript4[1] = 0;
        for (; (long)descript4 < nrows; descript4 = (uint  [2])((long)descript4 + 1)) {
          iVar3 = ffgi4b(fptr,ii,2,4,(int *)&local_60,status);
          if (0 < iVar3) {
            return *status;
          }
          if (heapaddr_local != (LONGLONG *)0x0) {
            *heapaddr_local = (ulong)local_60;
            heapaddr_local = heapaddr_local + 1;
          }
          if (rowsize != 0) {
            *(ulong *)rowsize = (ulong)local_5c;
            rowsize = rowsize + 8;
          }
          ii = lVar2 + ii;
        }
      }
      else {
        descript4[0] = 0;
        descript4[1] = 0;
        for (; (long)descript4 < nrows; descript4 = (uint  [2])((long)descript4 + 1)) {
          iVar3 = ffgi8b(fptr,ii,2,8,(long *)&colptr,status);
          if (0 < iVar3) {
            return *status;
          }
          if (heapaddr_local != (LONGLONG *)0x0) {
            *heapaddr_local = (LONGLONG)colptr;
            heapaddr_local = heapaddr_local + 1;
          }
          if (rowsize != 0) {
            *(LONGLONG *)rowsize = descript8[0];
            rowsize = rowsize + 8;
          }
          ii = lVar2 + ii;
        }
      }
      fptr_local._4_4_ = *status;
    }
    else {
      *status = 0x13d;
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgdessll(fitsfile *fptr, /* I - FITS file pointer                      */
           int colnum,     /* I - column number (1 = 1st column of table)   */
           LONGLONG firstrow,  /* I - first row  (1 = 1st row of table)         */
           LONGLONG nrows,     /* I - number or rows to read                    */
           LONGLONG *length,   /* O - number of elements in the row         */
           LONGLONG *heapaddr, /* O - heap pointer to the data              */
           int *status)    /* IO - error status                             */
/*
  get (read) a range of variable length vector descriptors from the table.
*/
{
    LONGLONG rowsize, bytepos;
    long  ii;
    unsigned int descript4[2] = {0,0};
    LONGLONG descript8[2] = {0,0};
    tcolumn *colptr;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    colptr = (fptr->Fptr)->tableptr;  /* point to first column structure */
    colptr += (colnum - 1);           /* offset to the correct column */

    if (colptr->tdatatype >= 0) {
        *status = NOT_VARI_LEN;
        return(*status);
    }

    rowsize = (fptr->Fptr)->rowlength;
    bytepos = (fptr->Fptr)->datastart + 
                  (rowsize  * (firstrow - 1)) +
                  colptr->tbcol;

    if (colptr->tform[0] == 'P' || colptr->tform[1] == 'P')
    {
        /* read 4-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
            if (ffgi4b(fptr, bytepos, 2, 4, (INT32BIT *) descript4, status) <= 0)
	    { 
              if (length) {
                *length =   (LONGLONG) descript4[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = (LONGLONG) descript4[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    else  /* this is for 'Q' columns */
    {
        /* read 8-byte descriptors */
        for (ii = 0; ii < nrows; ii++)
        {
	    /* read descriptors */
	    /* cast to type (long *) even though it is actually (LONGLONG *) */
            if (ffgi8b(fptr, bytepos, 2, 8, (long *) descript8, status) <= 0)
	    { 
              if (length) {
                *length =   descript8[0];   /* 1st word is the length  */
                length++;
	      }

              if (heapaddr) {
                *heapaddr = descript8[1];   /* 2nd word is the address */
                heapaddr++;
	      }
              bytepos += rowsize;
	    }
	    else
	      return(*status);
        }
    }
    return(*status);
}